

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O0

uint64_t compute_cut_hash(HighsInt *Rindex,double *Rvalue,double maxabscoef,HighsInt Rlen)

{
  u32 uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  reference pvVar3;
  u64 uVar4;
  int in_EDX;
  HighsInt i;
  double scale;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valueHashCodes;
  undefined4 in_stack_00000078;
  allocator_type *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(long)in_EDX;
  local_1c = in_EDX;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x5ac8ad);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (pvVar2,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x5ac8cd);
  for (local_5c = 0; local_5c < local_1c; local_5c = local_5c + 1) {
    uVar1 = HighsHashHelpers::double_hash_code((double)in_stack_ffffffffffffff80);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_38,(long)local_5c);
    *pvVar3 = uVar1;
  }
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           HighsHashHelpers::vector_hash<int,_0>((int *)maxabscoef,CONCAT44(Rlen,in_stack_00000078))
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x5ac996);
  uVar4 = HighsHashHelpers::vector_hash<unsigned_int,_0>
                    ((uint *)maxabscoef,CONCAT44(Rlen,in_stack_00000078));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar2);
  return (ulong)pvVar2 ^ uVar4 >> 0x20;
}

Assistant:

static uint64_t compute_cut_hash(const HighsInt* Rindex, const double* Rvalue,
                                 double maxabscoef, const HighsInt Rlen) {
  std::vector<uint32_t> valueHashCodes(Rlen);

  double scale = 1.0 / maxabscoef;
  for (HighsInt i = 0; i < Rlen; ++i)
    valueHashCodes[i] = HighsHashHelpers::double_hash_code(scale * Rvalue[i]);

  return HighsHashHelpers::vector_hash(Rindex, Rlen) ^
         (HighsHashHelpers::vector_hash(valueHashCodes.data(), Rlen) >> 32);
}